

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall bpwriter::format_char(bpwriter *this,vm_val_t *val)

{
  int32_t iVar1;
  char *pcVar2;
  size_t sVar3;
  bpwriter *in_RDI;
  int i;
  size_t len;
  char *str;
  undefined4 in_stack_ffffffffffffffc8;
  wchar_t in_stack_ffffffffffffffcc;
  
  pcVar2 = vm_val_t::get_as_string
                     ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (pcVar2 == (char *)0x0) {
    iVar1 = vm_val_t::cast_to_int((vm_val_t *)in_RDI);
    if ((iVar1 < 0) || (0xffff < iVar1)) {
      err_throw(0);
    }
    putwch(in_RDI,in_stack_ffffffffffffffcc);
  }
  else {
    sVar3 = vmb_get_len((char *)0x2ac1c9);
    if (sVar3 == 0) {
      putch(in_RDI,(char)((uint)in_stack_ffffffffffffffcc >> 0x18));
    }
    else {
      utf8_ptr::s_getch(pcVar2 + 2);
      putwch(in_RDI,in_stack_ffffffffffffffcc);
    }
  }
  return;
}

Assistant:

void format_char(VMG_ const vm_val_t *val)
    {
        /* check what we have */
        const char *str = val->get_as_string(vmg0_);
        if (str != 0)
        {
            /* it's a string - show the first character */
            size_t len = vmb_get_len(str);
            str += VMB_LEN;
            if (len != 0)
            {
                /* write the first character */
                putwch(utf8_ptr::s_getch(str));
            }
            else
            {
                /* empty string - write a null character */
                putch((char)0);
            }
        }
        else
        {
            /* it's not a string - get the integer value */
            int i = val->cast_to_int(vmg0_);

            /* make sure it's in range */
            if (i < 0 || i > 65535)
                err_throw(VMERR_NUM_OVERFLOW);

            /* write the character value */
            putwch((wchar_t)i);
        }
    }